

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.h
# Opt level: O0

bool Js::InterpreterStackFrame::IsBrLong(OpCode op,byte *ip)

{
  OpCode OVar1;
  undefined1 local_19;
  byte *ip_local;
  OpCode op_local;
  
  local_19 = false;
  if (op == ExtendedOpcodePrefix) {
    OVar1 = ByteCodeReader::PeekExtOp(ip);
    local_19 = OVar1 == BrLong;
  }
  return local_19;
}

Assistant:

static bool IsBrLong(OpCode op, const byte * ip)
        {
#ifdef BYTECODE_BRANCH_ISLAND
            CompileAssert(Js::OpCodeInfo<Js::OpCode::BrLong>::IsExtendedOpcode);
            return (op == OpCode::ExtendedOpcodePrefix) && ((OpCode)(ByteCodeReader::PeekExtOp(ip)) == OpCode::BrLong);
#else
            return false;
#endif
        }